

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

void calculate_func_cfg_live_info(gen_ctx_t gen_ctx,int freq_p)

{
  MIR_reg_t MVar1;
  VARR_reg_info_t *pVVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  const_bitmap_t src;
  reg_info_t *__ptr;
  bb_t_conflict pbVar6;
  bitmap_t src1;
  bb_t_conflict pbVar7;
  long lVar8;
  ulong uVar9;
  bitmap_t pVVar10;
  bitmap_t dst;
  char *op;
  uint uVar11;
  size_t sVar12;
  MIR_insn_t pMVar13;
  DLIST_bb_t *pDVar14;
  func_cfg_t pfVar15;
  bool bVar16;
  int local_b4;
  int local_b0;
  int local_ac;
  MIR_insn_t local_a8;
  MIR_reg_t early_clobbered_hard_reg2;
  MIR_reg_t early_clobbered_hard_reg1;
  MIR_reg_t var;
  int local_90;
  int local_8c;
  ulong local_88;
  long local_80;
  long local_78;
  reg_info_t *local_70;
  bitmap_iterator_t bi;
  int op_num;
  
  gen_ctx->lr_ctx->ssa_live_info_p = 0;
  local_90 = freq_p;
  src = (const_bitmap_t)
        _MIR_get_module_global_var_hard_regs(gen_ctx->ctx,gen_ctx->curr_func_item->module);
  pfVar15 = gen_ctx->curr_cfg;
  pVVar2 = pfVar15->reg_info;
  if ((pVVar2 == (VARR_reg_info_t *)0x0) || (pVVar2->varr == (reg_info_t *)0x0)) {
    op = "trunc";
LAB_001336d5:
    mir_varr_assert_fail(op,"reg_info_t");
  }
  pVVar2->els_num = 0;
  uVar11 = 0;
  uVar4 = pfVar15->max_var;
  do {
    if (uVar4 < uVar11) {
      pDVar14 = &pfVar15->bbs;
      while (pbVar6 = pDVar14->head, pbVar6 != (bb_t_conflict)0x0) {
        if ((((pbVar6->in == (bitmap_t)0x0) || (pbVar6->out == (bitmap_t)0x0)) ||
            (pbVar6->gen == (bitmap_t)0x0)) || (pbVar6->kill == (bitmap_t)0x0)) {
          __assert_fail("bb != ((void*)0) && bb->in != ((void*)0) && bb->out != ((void*)0) && bb->gen != ((void*)0) && bb->kill != ((void*)0)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x17bf,"void initiate_live_info(gen_ctx_t, int)");
        }
        bitmap_clear(pbVar6->in);
        bitmap_clear(pbVar6->out);
        bitmap_clear(pbVar6->gen);
        bitmap_clear(pbVar6->kill);
        pDVar14 = (DLIST_bb_t *)&(pbVar6->bb_link).next;
      }
      if ((src != (const_bitmap_t)0x0) && (gen_ctx->lr_ctx->scan_vars_num == 0)) {
        pbVar6 = DLIST_bb_t_el(&gen_ctx->curr_cfg->bbs,1);
        bitmap_copy(pbVar6->out,src);
      }
      pMVar13 = (((gen_ctx->curr_func_item->u).func)->insns).tail;
      iVar5 = local_90;
      do {
        if (pMVar13 == (MIR_insn_t)0x0) {
          solve_dataflow(gen_ctx,0,live_con_func_0,live_con_func_n,live_trans_func);
          if (gen_ctx->optimize_level != 0) {
            pDVar14 = &gen_ctx->curr_cfg->bbs;
            while (pbVar6 = pDVar14->head, pbVar6 != (bb_t_conflict)0x0) {
              early_clobbered_hard_reg1 = pbVar6->max_int_pressure;
              early_clobbered_hard_reg2 = pbVar6->max_fp_pressure;
              bi.bitmap = pbVar6->out;
              bi.nbit = 0;
              while (iVar5 = bitmap_iterator_next(&bi,(size_t *)&var), iVar5 != 0) {
                iVar5 = int_var_type_p(gen_ctx,var);
                increase_pressure(iVar5,pbVar6,(int *)&early_clobbered_hard_reg1,
                                  (int *)&early_clobbered_hard_reg2);
              }
              pDVar14 = (DLIST_bb_t *)&(pbVar6->bb_link).next;
            }
          }
          return;
        }
        pbVar6 = get_insn_bb(gen_ctx,pMVar13);
        src1 = (bitmap_t)
               _MIR_get_module_global_var_hard_regs(gen_ctx->ctx,gen_ctx->curr_func_item->module);
        local_70 = VARR_reg_info_taddr(gen_ctx->curr_cfg->reg_info);
        lVar8 = 1;
        if ((iVar5 != 0) && (gen_ctx->optimize_level != 0)) {
          iVar3 = bb_loop_level(pbVar6);
          lVar8 = 1;
          for (; 0 < iVar3; iVar3 = iVar3 + -1) {
            if (lVar8 < 0xfffffffffffffff) {
              lVar8 = lVar8 * 5;
            }
          }
        }
        local_b0 = 0;
        pbVar6->max_fp_pressure = 0;
        local_ac = 0;
        pbVar6->max_int_pressure = 0;
        local_b4 = 0;
        local_80 = 0x7fffffffffffffff - lVar8;
        local_78 = lVar8;
        while ((pMVar13 != (MIR_insn_t)0x0 &&
               (pbVar7 = get_insn_bb(gen_ctx,pMVar13), pbVar7 == pbVar6))) {
          local_a8 = pMVar13;
          if (*(int *)&pMVar13->field_0x18 == 0xba) {
            gen_ctx->lr_ctx->ssa_live_info_p = 1;
            MVar1 = pMVar13->ops[0].u.reg;
            var = MVar1;
            uVar4 = var_to_scan_var(gen_ctx,MVar1);
            pMVar13 = local_a8;
            if (-1 < (int)uVar4) {
              local_88 = (ulong)uVar4;
              iVar3 = bitmap_clear_bit_p(pbVar6->gen,local_88);
              if ((iVar3 != 0) && (gen_ctx->optimize_level != 0)) {
                iVar3 = int_var_type_p(gen_ctx,MVar1);
                if (iVar3 == 0) {
                  local_b0 = local_b0 + -1;
                }
                else {
                  local_ac = local_ac + -1;
                }
              }
              bitmap_set_bit_p(pbVar6->kill,local_88);
              pMVar13 = local_a8;
            }
          }
          else {
            if ((0xfffffffc < *(int *)&pMVar13->field_0x18 - 0xaaU) &&
               (gen_ctx->lr_ctx->scan_vars_num == 0)) {
              bitmap_ior(pbVar6->kill,pbVar6->kill,gen_ctx->call_used_hard_regs[0x12]);
              pVVar10 = pbVar6->gen;
              if (src1 == (bitmap_t)0x0) {
                bitmap_and_compl(pVVar10,pVVar10,gen_ctx->call_used_hard_regs[0x12]);
              }
              else {
                bitmap_ior_and_compl(pVVar10,src1,pVVar10,gen_ctx->call_used_hard_regs[0x12]);
              }
            }
            bi.nbit = (size_t)*(uint *)&pMVar13->field_0x1c;
            local_88 = CONCAT44(local_88._4_4_,local_ac);
            local_8c = local_b0;
            bi.bitmap = (bitmap_t)pMVar13;
            while (iVar3 = output_insn_var_iterator_next
                                     (gen_ctx,(insn_var_iterator_t *)&bi,&var,&op_num), MVar1 = var,
                  iVar3 != 0) {
              uVar9 = (ulong)var;
              uVar4 = var_to_scan_var(gen_ctx,var);
              if (-1 < (int)uVar4) {
                iVar3 = bitmap_clear_bit_p(pbVar6->gen,(ulong)uVar4);
                if ((iVar3 != 0) && (gen_ctx->optimize_level != 0)) {
                  iVar3 = int_var_type_p(gen_ctx,MVar1);
                  if (iVar3 == 0) {
                    local_8c = local_8c + -1;
                  }
                  else {
                    local_88 = CONCAT44(local_88._4_4_,(int)local_88 + -1);
                  }
                }
                bVar16 = iVar5 != 0;
                bitmap_set_bit_p(pbVar6->kill,(ulong)uVar4);
                iVar5 = local_90;
                if (0x21 < MVar1 && bVar16) {
                  lVar8 = local_70[uVar9].freq + local_78;
                  if (local_80 <= local_70[uVar9].freq) {
                    lVar8 = 0x7fffffffffffffff;
                  }
                  local_70[uVar9].freq = lVar8;
                }
              }
            }
            local_b0 = local_8c;
            local_ac = (int)local_88;
            bi.bitmap = (bitmap_t)local_a8;
            bi.nbit = (size_t)*(uint *)&local_a8->field_0x1c;
            while (iVar3 = input_insn_var_iterator_next
                                     (gen_ctx,(insn_var_iterator_t *)&bi,&var,&op_num), MVar1 = var,
                  iVar3 != 0) {
              uVar9 = (ulong)var;
              uVar4 = var_to_scan_var(gen_ctx,var);
              if (-1 < (int)uVar4) {
                iVar3 = bitmap_set_bit_p(pbVar6->gen,(ulong)uVar4);
                if ((iVar3 != 0) && (gen_ctx->optimize_level != 0)) {
                  iVar3 = int_var_type_p(gen_ctx,MVar1);
                  increase_pressure(iVar3,pbVar6,&local_ac,&local_b0);
                }
                if (0x21 < MVar1 && iVar5 != 0) {
                  lVar8 = local_70[uVar9].freq + local_78;
                  if (local_80 <= local_70[uVar9].freq) {
                    lVar8 = 0x7fffffffffffffff;
                  }
                  local_70[uVar9].freq = lVar8;
                }
              }
            }
            pMVar13 = local_a8;
            if (gen_ctx->lr_ctx->scan_vars_num == 0) {
              target_get_early_clobbered_hard_regs
                        (local_a8,&early_clobbered_hard_reg1,&early_clobbered_hard_reg2);
              uVar9 = (ulong)early_clobbered_hard_reg1;
              if (uVar9 != 0xffffffff) {
                if (gen_ctx->optimize_level != 0) {
                  local_b4 = int_var_type_p(gen_ctx,early_clobbered_hard_reg1);
                  increase_pressure(local_b4,pbVar6,&local_ac,&local_b0);
                }
                bitmap_clear_bit_p(pbVar6->gen,uVar9);
                bitmap_set_bit_p(pbVar6->kill,uVar9);
                if (gen_ctx->optimize_level != 0) {
                  if (local_b4 == 0) {
                    local_b0 = local_b0 + -1;
                    local_b4 = 0;
                  }
                  else {
                    local_ac = local_ac + -1;
                    local_b4 = 1;
                  }
                }
              }
              uVar9 = (ulong)early_clobbered_hard_reg2;
              if (uVar9 != 0xffffffff) {
                if (gen_ctx->optimize_level != 0) {
                  local_b4 = int_var_type_p(gen_ctx,early_clobbered_hard_reg2);
                  increase_pressure(local_b4,pbVar6,&local_ac,&local_b0);
                }
                bitmap_clear_bit_p(pbVar6->gen,uVar9);
                bitmap_set_bit_p(pbVar6->kill,uVar9);
                if (gen_ctx->optimize_level != 0) {
                  if (local_b4 == 0) {
                    local_b0 = local_b0 + -1;
                    local_b4 = 0;
                  }
                  else {
                    local_ac = local_ac + -1;
                    local_b4 = 1;
                  }
                }
              }
              pMVar13 = local_a8;
              if (0xfffffffc < *(int *)&local_a8->field_0x18 - 0xaaU) {
                if (gen_ctx->optimize_level == 0) {
                  pVVar10 = *(bitmap_t *)((long)local_a8->data + 8);
                  if (pVVar10 == (bitmap_t)0x0) goto LAB_00133496;
                  dst = pbVar6->gen;
                }
                else {
                  dst = pbVar6->gen;
                  pVVar10 = *(bitmap_t *)((long)local_a8->data + 0x48);
                }
                bitmap_ior(dst,dst,pVVar10);
              }
            }
          }
LAB_00133496:
          pMVar13 = (pMVar13->insn_link).prev;
        }
      } while( true );
    }
    pVVar2 = pfVar15->reg_info;
    __ptr = pVVar2->varr;
    if (__ptr == (reg_info_t *)0x0) {
      op = "expand";
      goto LAB_001336d5;
    }
    sVar12 = pVVar2->els_num;
    uVar9 = sVar12 + 1;
    if (pVVar2->size < uVar9) {
      sVar12 = (uVar9 >> 1) + uVar9;
      __ptr = (reg_info_t *)realloc(__ptr,sVar12 * 0x10);
      pVVar2->varr = __ptr;
      pVVar2->size = sVar12;
      sVar12 = pVVar2->els_num;
      uVar9 = sVar12 + 1;
    }
    pVVar2->els_num = uVar9;
    uVar11 = uVar11 + 1;
    __ptr[sVar12].freq = 0;
    __ptr[sVar12].live_length = 0;
    pfVar15 = gen_ctx->curr_cfg;
  } while( true );
}

Assistant:

static void calculate_func_cfg_live_info (gen_ctx_t gen_ctx, int freq_p) {
  ssa_live_info_p = FALSE;
  initiate_live_info (gen_ctx, freq_p);
  solve_dataflow (gen_ctx, FALSE, live_con_func_0, live_con_func_n, live_trans_func);
  if (optimize_level != 0) update_bb_pressure (gen_ctx);
}